

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

double * marsaglia_generate(double *values,int N,double average,double deviation)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (1 < N) {
    lVar3 = 0;
    do {
      do {
        do {
          iVar1 = rand();
          dVar6 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
          iVar1 = rand();
          dVar7 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
          dVar4 = dVar6 * dVar6 + dVar7 * dVar7;
        } while (1.0 <= dVar4);
      } while ((dVar4 == 0.0) && (!NAN(dVar4)));
      dVar5 = log(dVar4);
      dVar4 = (dVar5 * -2.0) / dVar4;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      values[lVar3] = dVar6 * dVar4;
      values[lVar3 + 1] = dVar7 * dVar4;
      lVar3 = lVar3 + 2;
    } while ((int)lVar3 < N + -1);
  }
  if ((N & 1U) != 0) {
    do {
      do {
        iVar1 = rand();
        dVar6 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
        iVar1 = rand();
        dVar4 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
        dVar4 = dVar6 * dVar6 + dVar4 * dVar4;
      } while (1.0 <= dVar4);
    } while ((dVar4 == 0.0) && (!NAN(dVar4)));
    dVar7 = log(dVar4);
    dVar4 = (dVar7 * -2.0) / dVar4;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    values[N + -1] = dVar6 * dVar4;
  }
  if (0 < N) {
    uVar2 = 0;
    do {
      values[uVar2] = values[uVar2] * deviation + average;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  return values;
}

Assistant:

double* marsaglia_generate(double *values, int N, double average, double  deviation)
{
	int i;
	int M;
	double x, y, rsq, f;

	M = N + N % 2;



	for (i = 0; i < N - 1; i += 2)
	{
		do {
			x = 2.0 * rand() / (double)RAND_MAX - 1.0;
			y = 2.0 * rand() / (double)RAND_MAX - 1.0;
			rsq = x * x + y * y;
		} while (rsq >= 1. || rsq == 0.);
		f = sqrt(-2.0 * log(rsq) / rsq);
		values[i] = x * f;
		values[i + 1] = y * f;
	}

	if (M != N) {
		do {
			x = 2.0 * rand() / (double)RAND_MAX - 1.0;
			y = 2.0 * rand() / (double)RAND_MAX - 1.0;
			rsq = x * x + y * y;
		} while (rsq >= 1. || rsq == 0.);
		f = sqrt(-2.0 * log(rsq) / rsq);
		values[N - 1] = x * f;
	}


	for (i = 0; i < N; ++i) {
		values[i] = (values[i] * deviation + average);
	}
	return values;
}